

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O2

bool util::is_valid_player_name(char *str,size_t len,bool allow_empty)

{
  int iVar1;
  size_t i;
  size_t sVar2;
  bool bVar3;
  
  if ((len < 0x41) && ((allow_empty || ((str != (char *)0x0 && (*str != '0')))))) {
    sVar2 = 0;
    do {
      bVar3 = len == sVar2;
      if (bVar3) {
        return bVar3;
      }
      if (str[sVar2] == 0x20) {
        return bVar3;
      }
      iVar1 = isprint((int)str[sVar2]);
      sVar2 = sVar2 + 1;
    } while (iVar1 != 0);
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool is_valid_player_name(const char* str, size_t len, bool allow_empty/* = true*/)
{
	constexpr size_t max_name_len = 64;
	if (len > max_name_len)
		return false;

	if (!allow_empty && (str == nullptr || *str == '0'))
		return false;

	for (size_t i = 0; i < len; ++i)
		if (str[i] == ' ' || !isprint(str[i]))
			return false;

	return true;
}